

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O0

vector<DevMap> * anon_unknown.dwarf_211787::probe_devices(snd_pcm_stream_t stream)

{
  FILE *pFVar1;
  code *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 in_ESI;
  vector<DevMap> *in_RDI;
  value_type *entry_1;
  string device;
  string device_prefix;
  int dev;
  string card_prefix;
  char *cardid;
  char *cardname;
  snd_ctl_t *handle;
  string name;
  int err;
  int card;
  string main_prefix;
  value_type *entry;
  char *oldsep;
  string spec;
  char *sep;
  char *curdev;
  char *customdevs;
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_t *info;
  vector<DevMap> *devlist;
  DevMap *in_stack_fffffffffffffb40;
  FILE *pFVar8;
  DevMap *in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb54;
  FILE *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  char (*in_stack_fffffffffffffb70) [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb78;
  uint in_stack_fffffffffffffb8c;
  int in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  char *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  uint uVar9;
  char *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  char *in_stack_fffffffffffffbd8;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [72];
  string local_250 [32];
  string local_230 [36];
  int local_20c [11];
  string local_1e0 [32];
  char *local_1c0;
  char *local_1b8;
  undefined4 local_1ac;
  undefined8 local_1a8;
  string local_1a0 [32];
  string local_180 [32];
  int local_160;
  uint local_15c [11];
  string local_130 [32];
  reference local_110;
  undefined1 local_106;
  byte local_105;
  allocator local_104;
  byte local_103;
  allocator<char> local_102;
  allocator<char> local_101 [33];
  string asStack_e0 [32];
  char *local_c0;
  byte local_b4;
  allocator local_b3;
  byte local_b2;
  allocator<char> local_b1;
  string local_b0 [32];
  char *local_90;
  char *local_88;
  char *local_80;
  undefined1 local_73;
  allocator local_72;
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  undefined8 local_30 [3];
  undefined8 local_18;
  byte local_d;
  undefined4 local_c;
  
  local_d = 0;
  local_c = in_ESI;
  std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
  vector((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
          *)0x22cf36);
  (*(anonymous_namespace)::psnd_ctl_card_info_malloc)(&local_18);
  (*(anonymous_namespace)::psnd_pcm_info_malloc)(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"ALSA Default",&local_71);
  local_73 = 1;
  pcVar3 = GetConfigValue(in_stack_fffffffffffffbd8,
                          (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                          in_stack_fffffffffffffbc8,
                          (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar3,&local_72);
  local_73 = 0;
  std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
  emplace_back<(anonymous_namespace)::DevMap>
            ((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
              *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
             in_stack_fffffffffffffb48);
  DevMap::~DevMap(in_stack_fffffffffffffb40);
  std::allocator<char>::~allocator((allocator<char> *)&local_72);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = GetConfigValue(in_stack_fffffffffffffbd8,
                            (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                            in_stack_fffffffffffffbc8,
                            (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
  while ((local_88 = local_80, local_80 != (char *)0x0 && (*local_80 != '\0'))) {
    local_80 = strchr(local_80,0x3b);
    pcVar4 = strchr(local_88,0x3d);
    pcVar3 = local_88;
    if (pcVar4 == (char *)0x0) {
      local_b2 = 0;
      local_b4 = 0;
      local_90 = pcVar4;
      if (local_80 == (char *)0x0) {
        std::allocator<char>::allocator();
        local_b4 = 1;
        std::__cxx11::string::string(local_b0,pcVar3,&local_b3);
      }
      else {
        local_80 = local_80 + 1;
        std::allocator<char>::allocator();
        local_b2 = 1;
        std::__cxx11::string::string<char_const*,void>
                  (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                   (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   (allocator<char> *)in_stack_fffffffffffffb48);
      }
      if ((local_b4 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_b3);
      }
      if ((local_b2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_b1);
      }
      pFVar1 = gLogFile;
      if (0 < (int)gLogLevel) {
        uVar7 = std::__cxx11::string::c_str();
        fprintf((FILE *)pFVar1,"[ALSOFT] (EE) Invalid ALSA device specification \"%s\"\n",uVar7);
      }
      std::__cxx11::string::~string(local_b0);
    }
    else {
      local_90 = pcVar4 + 1;
      local_c0 = pcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                 (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 (allocator<char> *)in_stack_fffffffffffffb48);
      pcVar3 = local_90;
      local_106 = 1;
      local_103 = 0;
      local_105 = 0;
      if (local_80 == (char *)0x0) {
        std::allocator<char>::allocator();
        local_105 = 1;
        std::__cxx11::string::string(asStack_e0,pcVar3,&local_104);
      }
      else {
        local_80 = local_80 + 1;
        std::allocator<char>::allocator();
        local_103 = 1;
        std::__cxx11::string::string<char_const*,void>
                  (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
                   (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   (allocator<char> *)in_stack_fffffffffffffb48);
      }
      local_106 = 0;
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::emplace_back<(anonymous_namespace)::DevMap>
                ((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                  *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 in_stack_fffffffffffffb48);
      DevMap::~DevMap(in_stack_fffffffffffffb40);
      if ((local_105 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_104);
      }
      if ((local_103 & 1) != 0) {
        std::allocator<char>::~allocator(&local_102);
      }
      std::allocator<char>::~allocator(local_101);
      local_110 = std::
                  vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                  ::back((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                          *)in_stack_fffffffffffffb40);
      pFVar1 = gLogFile;
      if (2 < (int)gLogLevel) {
        uVar7 = std::__cxx11::string::c_str();
        uVar6 = std::__cxx11::string::c_str();
        fprintf((FILE *)pFVar1,"[ALSOFT] (II) Got device \"%s\", \"%s\"\n",uVar7,uVar6);
      }
    }
  }
  prefix_name(SND_PCM_STREAM_PLAYBACK);
  ConfigValueStr_abi_cxx11_
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
             (char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  al::optional<std::__cxx11::string>::value_or<char_const(&)[8]>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffb40);
  local_15c[0] = 0xffffffff;
  local_160 = (*(anonymous_namespace)::psnd_card_next)(local_15c);
  while (-1 < local_160 && -1 < (int)local_15c[0]) {
    std::__cxx11::to_string(in_stack_fffffffffffffb8c);
    std::operator+((char *)in_stack_fffffffffffffb48,&in_stack_fffffffffffffb40->name);
    std::__cxx11::string::~string(local_1a0);
    pcVar2 = (anonymous_namespace)::psnd_ctl_open;
    uVar7 = std::__cxx11::string::c_str();
    local_160 = (*pcVar2)(&local_1a8,uVar7,0);
    uVar9 = local_15c[0];
    if (local_160 < 0) {
      if (0 < (int)gLogLevel) {
        pFVar8 = (FILE *)gLogFile;
        uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_160);
        fprintf(pFVar8,"[ALSOFT] (EE) control open (hw:%d): %s\n",(ulong)uVar9,uVar7);
      }
      local_1ac = 10;
    }
    else {
      local_160 = (*(anonymous_namespace)::psnd_ctl_card_info)(local_1a8,local_18);
      pFVar1 = gLogFile;
      if (local_160 < 0) {
        if (0 < (int)gLogLevel) {
          uVar9 = local_15c[0];
          uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_160);
          fprintf((FILE *)pFVar1,"[ALSOFT] (EE) control hardware info (hw:%d): %s\n",(ulong)uVar9,
                  uVar7);
        }
        (*(anonymous_namespace)::psnd_ctl_close)(local_1a8);
        local_1ac = 10;
      }
      else {
        local_1b8 = (char *)(*(anonymous_namespace)::psnd_ctl_card_info_get_name)(local_18);
        pcVar3 = (char *)(*(anonymous_namespace)::psnd_ctl_card_info_get_id)(local_18);
        local_1c0 = pcVar3;
        pcVar4 = prefix_name(SND_PCM_STREAM_PLAYBACK);
        std::__cxx11::string::operator=(local_180,pcVar4);
        std::__cxx11::string::operator+=(local_180,'-');
        std::__cxx11::string::operator+=(local_180,local_1c0);
        std::__cxx11::string::c_str();
        ConfigValueStr_abi_cxx11_
                  (pcVar3,pcVar4,
                   (char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        al::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffb58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
        al::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffb40);
        local_20c[0] = -1;
        while( true ) {
          in_stack_fffffffffffffb9c =
               (*(anonymous_namespace)::psnd_ctl_pcm_next_device)(local_1a8,local_20c);
          if ((in_stack_fffffffffffffb9c < 0) && (0 < (int)gLogLevel)) {
            fprintf((FILE *)gLogFile,"[ALSOFT] (EE) snd_ctl_pcm_next_device failed\n");
          }
          if (local_20c[0] < 0) break;
          (*(anonymous_namespace)::psnd_pcm_info_set_device)(local_30[0],local_20c[0]);
          (*(anonymous_namespace)::psnd_pcm_info_set_subdevice)(local_30[0],0);
          (*(anonymous_namespace)::psnd_pcm_info_set_stream)(local_30[0],local_c);
          in_stack_fffffffffffffb98 =
               (*(anonymous_namespace)::psnd_ctl_pcm_info)(local_1a8,local_30[0]);
          pFVar1 = gLogFile;
          local_160 = in_stack_fffffffffffffb98;
          if (in_stack_fffffffffffffb98 < 0) {
            if ((in_stack_fffffffffffffb98 != -2) && (0 < (int)gLogLevel)) {
              in_stack_fffffffffffffb8c = local_15c[0];
              uVar7 = (*(anonymous_namespace)::psnd_strerror)(in_stack_fffffffffffffb98);
              fprintf((FILE *)pFVar1,"[ALSOFT] (EE) control digital audio info (hw:%d): %s\n",
                      (ulong)in_stack_fffffffffffffb8c,uVar7);
            }
          }
          else {
            pcVar5 = prefix_name(SND_PCM_STREAM_PLAYBACK);
            std::__cxx11::string::operator=(local_180,pcVar5);
            std::__cxx11::string::operator+=(local_180,'-');
            std::__cxx11::string::operator+=(local_180,local_1c0);
            std::__cxx11::string::operator+=(local_180,'-');
            std::__cxx11::to_string(in_stack_fffffffffffffb8c);
            std::__cxx11::string::operator+=(local_180,local_230);
            std::__cxx11::string::~string(local_230);
            std::__cxx11::string::c_str();
            ConfigValueStr_abi_cxx11_
                      (pcVar3,pcVar4,
                       (char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
            al::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffb58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
            al::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffb40);
            std::__cxx11::string::operator=(local_180,local_1b8);
            std::__cxx11::string::operator+=(local_180,", ");
            pcVar5 = (char *)(*(anonymous_namespace)::psnd_pcm_info_get_name)(local_30[0]);
            std::__cxx11::string::operator+=(local_180,pcVar5);
            std::__cxx11::string::operator+=(local_180," (CARD=");
            std::__cxx11::string::operator+=(local_180,local_1c0);
            std::__cxx11::string::operator+=(local_180,",DEV=");
            std::__cxx11::to_string(in_stack_fffffffffffffb8c);
            std::__cxx11::string::operator+=(local_180,local_298);
            std::__cxx11::string::~string(local_298);
            std::__cxx11::string::operator+=(local_180,')');
            std::__cxx11::string::string(local_2b8,local_250);
            std::__cxx11::string::operator+=(local_2b8,"CARD=");
            std::__cxx11::string::operator+=(local_2b8,local_1c0);
            std::__cxx11::string::operator+=(local_2b8,",DEV=");
            std::__cxx11::to_string(in_stack_fffffffffffffb8c);
            std::__cxx11::string::operator+=(local_2b8,local_2d8);
            std::__cxx11::string::~string(local_2d8);
            std::__cxx11::string::string(local_318,local_180);
            std::__cxx11::string::string(local_2f8,local_2b8);
            std::
            vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            ::emplace_back<(anonymous_namespace)::DevMap>
                      ((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                        *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                       in_stack_fffffffffffffb48);
            DevMap::~DevMap(in_stack_fffffffffffffb40);
            std::
            vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            ::back((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                    *)in_stack_fffffffffffffb40);
            if (2 < (int)gLogLevel) {
              in_stack_fffffffffffffb58 = (FILE *)gLogFile;
              uVar7 = std::__cxx11::string::c_str();
              uVar6 = std::__cxx11::string::c_str();
              fprintf(in_stack_fffffffffffffb58,"[ALSOFT] (II) Got device \"%s\", \"%s\"\n",uVar7,
                      uVar6);
            }
            std::__cxx11::string::~string(local_2b8);
            std::__cxx11::string::~string(local_250);
          }
        }
        (*(anonymous_namespace)::psnd_ctl_close)(local_1a8);
        std::__cxx11::string::~string(local_1e0);
        local_1ac = 0;
      }
    }
    std::__cxx11::string::~string(local_180);
    in_stack_fffffffffffffb54 = (*(anonymous_namespace)::psnd_card_next)(local_15c);
    local_160 = in_stack_fffffffffffffb54;
  }
  if ((local_160 < 0) && (0 < (int)gLogLevel)) {
    pFVar8 = (FILE *)gLogFile;
    uVar7 = (*(anonymous_namespace)::psnd_strerror)(local_160);
    fprintf(pFVar8,"[ALSOFT] (EE) snd_card_next failed: %s\n",uVar7);
  }
  (*(anonymous_namespace)::psnd_pcm_info_free)(local_30[0]);
  (*(anonymous_namespace)::psnd_ctl_card_info_free)(local_18);
  local_d = 1;
  local_1ac = 1;
  std::__cxx11::string::~string(local_130);
  if ((local_d & 1) == 0) {
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    ~vector((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
             *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
  }
  return in_RDI;
}

Assistant:

al::vector<DevMap> probe_devices(snd_pcm_stream_t stream)
{
    al::vector<DevMap> devlist;

    snd_ctl_card_info_t *info;
    snd_ctl_card_info_malloc(&info);
    snd_pcm_info_t *pcminfo;
    snd_pcm_info_malloc(&pcminfo);

    devlist.emplace_back(DevMap{alsaDevice,
        GetConfigValue(nullptr, "alsa", (stream==SND_PCM_STREAM_PLAYBACK) ? "device" : "capture",
            "default")});

    const char *customdevs{GetConfigValue(nullptr, "alsa",
        (stream == SND_PCM_STREAM_PLAYBACK) ? "custom-devices" : "custom-captures", "")};
    while(const char *curdev{customdevs})
    {
        if(!curdev[0]) break;
        customdevs = strchr(curdev, ';');
        const char *sep{strchr(curdev, '=')};
        if(!sep)
        {
            std::string spec{customdevs ? std::string(curdev, customdevs++) : std::string(curdev)};
            ERR("Invalid ALSA device specification \"%s\"\n", spec.c_str());
            continue;
        }

        const char *oldsep{sep++};
        devlist.emplace_back(DevMap{std::string(curdev, oldsep),
            customdevs ? std::string(sep, customdevs++) : std::string(sep)});
        const auto &entry = devlist.back();
        TRACE("Got device \"%s\", \"%s\"\n", entry.name.c_str(), entry.device_name.c_str());
    }

    const std::string main_prefix{
        ConfigValueStr(nullptr, "alsa", prefix_name(stream)).value_or("plughw:")};

    int card{-1};
    int err{snd_card_next(&card)};
    for(;err >= 0 && card >= 0;err = snd_card_next(&card))
    {
        std::string name{"hw:" + std::to_string(card)};

        snd_ctl_t *handle;
        if((err=snd_ctl_open(&handle, name.c_str(), 0)) < 0)
        {
            ERR("control open (hw:%d): %s\n", card, snd_strerror(err));
            continue;
        }
        if((err=snd_ctl_card_info(handle, info)) < 0)
        {
            ERR("control hardware info (hw:%d): %s\n", card, snd_strerror(err));
            snd_ctl_close(handle);
            continue;
        }

        const char *cardname{snd_ctl_card_info_get_name(info)};
        const char *cardid{snd_ctl_card_info_get_id(info)};
        name = prefix_name(stream);
        name += '-';
        name += cardid;
        const std::string card_prefix{
            ConfigValueStr(nullptr, "alsa", name.c_str()).value_or(main_prefix)};

        int dev{-1};
        while(1)
        {
            if(snd_ctl_pcm_next_device(handle, &dev) < 0)
                ERR("snd_ctl_pcm_next_device failed\n");
            if(dev < 0) break;

            snd_pcm_info_set_device(pcminfo, static_cast<ALuint>(dev));
            snd_pcm_info_set_subdevice(pcminfo, 0);
            snd_pcm_info_set_stream(pcminfo, stream);
            if((err=snd_ctl_pcm_info(handle, pcminfo)) < 0)
            {
                if(err != -ENOENT)
                    ERR("control digital audio info (hw:%d): %s\n", card, snd_strerror(err));
                continue;
            }

            /* "prefix-cardid-dev" */
            name = prefix_name(stream);
            name += '-';
            name += cardid;
            name += '-';
            name += std::to_string(dev);
            const std::string device_prefix{
                ConfigValueStr(nullptr, "alsa", name.c_str()).value_or(card_prefix)};

            /* "CardName, PcmName (CARD=cardid,DEV=dev)" */
            name = cardname;
            name += ", ";
            name += snd_pcm_info_get_name(pcminfo);
            name += " (CARD=";
            name += cardid;
            name += ",DEV=";
            name += std::to_string(dev);
            name += ')';

            /* "devprefixCARD=cardid,DEV=dev" */
            std::string device{device_prefix};
            device += "CARD=";
            device += cardid;
            device += ",DEV=";
            device += std::to_string(dev);
            
            devlist.emplace_back(DevMap{std::move(name), std::move(device)});
            const auto &entry = devlist.back();
            TRACE("Got device \"%s\", \"%s\"\n", entry.name.c_str(), entry.device_name.c_str());
        }
        snd_ctl_close(handle);
    }
    if(err < 0)
        ERR("snd_card_next failed: %s\n", snd_strerror(err));

    snd_pcm_info_free(pcminfo);
    snd_ctl_card_info_free(info);

    return devlist;
}